

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O3

EstimatorStats *
GetErrorStatistics(EstimatorStats *__return_storage_ptr__,
                  vector<Estimates,_std::allocator<Estimates>_> *algo_estimates,Count true_count)

{
  double dVar1;
  pointer pEVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  double *pdVar6;
  pointer pdVar7;
  pointer pEVar8;
  double *pdVar9;
  pointer pEVar10;
  ulong uVar11;
  pointer pEVar12;
  pointer pEVar13;
  pointer pEVar14;
  uint uVar15;
  ulong uVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  vector<double,_std::allocator<double>_> algo_error_percentage_list;
  vector<double,_std::allocator<double>_> diff;
  allocator_type local_71;
  double local_70;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  uVar16 = (long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  uVar15 = (uint)(uVar16 >> 5);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)(int)uVar15,(allocator_type *)&local_40);
  if (0 < (int)uVar15) {
    pEVar8 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = (ABS(pEVar8->estimate - (double)true_count) * 100.0) / (double)true_count;
      uVar11 = uVar11 + 1;
      pEVar8 = pEVar8 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar11);
  }
  iVar5 = (int)(((uint)(uVar16 >> 0x24) & 1) + uVar15) >> 1;
  if ((local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start !=
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish) &&
     (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start + iVar5 !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    uVar16 = (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  pdVar9 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  pdVar6 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar9 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish &&
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    dVar22 = *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      dVar17 = *pdVar9;
      uVar18 = SUB84(dVar17,0);
      uVar19 = (undefined4)((ulong)dVar17 >> 0x20);
      pdVar4 = pdVar9;
      if (dVar17 <= dVar22) {
        uVar18 = SUB84(dVar22,0);
        uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
        pdVar4 = pdVar6;
      }
      pdVar6 = pdVar4;
      pdVar9 = pdVar9 + 1;
      dVar22 = (double)CONCAT44(uVar19,uVar18);
    } while (pdVar9 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_70 = 0.0;
  for (pdVar9 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
    local_70 = local_70 + *pdVar9;
  }
  local_50 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar5];
  local_48 = *pdVar6;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,(long)(int)uVar15,&local_71);
  dVar22 = local_70 / (double)(int)uVar15;
  pdVar6 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar9 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
    *pdVar6 = *pdVar9 - dVar22;
    pdVar6 = pdVar6 + 1;
  }
  dVar17 = 0.0;
  for (pdVar7 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 != local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
    dVar17 = dVar17 + *pdVar7 * *pdVar7;
  }
  dVar17 = dVar17 / (double)(int)uVar15;
  if (dVar17 < 0.0) {
    local_70 = dVar22;
    dVar17 = sqrt(dVar17);
    dVar22 = local_70;
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  pEVar8 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar10 = pEVar8 + 1;
  pEVar12 = pEVar10;
  pEVar14 = pEVar8;
  if (pEVar10 == pEVar2 || pEVar8 == pEVar2) {
    uVar18 = *(undefined4 *)&pEVar8->fraction_of_vertices_seen;
    uVar19 = *(undefined4 *)((long)&pEVar8->fraction_of_vertices_seen + 4);
    uVar20 = *(undefined4 *)&pEVar8->fraction_of_edges_seen;
    uVar21 = *(undefined4 *)((long)&pEVar8->fraction_of_edges_seen + 4);
  }
  else {
    do {
      pEVar13 = pEVar12;
      if (pEVar12->fraction_of_vertices_seen < pEVar14->fraction_of_vertices_seen ||
          pEVar12->fraction_of_vertices_seen == pEVar14->fraction_of_vertices_seen) {
        pEVar13 = pEVar14;
      }
      pEVar12 = pEVar12 + 1;
      pEVar14 = pEVar13;
    } while (pEVar12 != pEVar2);
    uVar18 = SUB84(pEVar13->fraction_of_vertices_seen,0);
    uVar19 = (undefined4)((ulong)pEVar13->fraction_of_vertices_seen >> 0x20);
    pEVar12 = pEVar10;
    pEVar14 = pEVar8;
    do {
      pEVar13 = pEVar12;
      if (pEVar12->fraction_of_edges_seen < pEVar14->fraction_of_edges_seen ||
          pEVar12->fraction_of_edges_seen == pEVar14->fraction_of_edges_seen) {
        pEVar13 = pEVar14;
      }
      pEVar12 = pEVar12 + 1;
      pEVar14 = pEVar13;
    } while (pEVar12 != pEVar2);
    uVar20 = SUB84(pEVar13->fraction_of_edges_seen,0);
    uVar21 = (undefined4)((ulong)pEVar13->fraction_of_edges_seen >> 0x20);
    do {
      pEVar12 = pEVar10;
      if (pEVar10->fraction_of_edges_seen < pEVar8->fraction_of_edges_seen ||
          pEVar10->fraction_of_edges_seen == pEVar8->fraction_of_edges_seen) {
        pEVar12 = pEVar8;
      }
      pEVar8 = pEVar12;
      pEVar10 = pEVar10 + 1;
    } while (pEVar10 != pEVar2);
  }
  dVar1 = pEVar8->query_complexity;
  __return_storage_ptr__->no_of_repeats = uVar15;
  __return_storage_ptr__->mean_error_percentage = dVar22;
  __return_storage_ptr__->median_error_percentage = local_50;
  __return_storage_ptr__->stddev_error_percentage = dVar17;
  __return_storage_ptr__->max_error_percentage = local_48;
  *(undefined4 *)&__return_storage_ptr__->vertices_seen_max_percentage = uVar18;
  *(undefined4 *)((long)&__return_storage_ptr__->vertices_seen_max_percentage + 4) = uVar19;
  *(undefined4 *)&__return_storage_ptr__->edges_seen_max_percentage = uVar20;
  *(undefined4 *)((long)&__return_storage_ptr__->edges_seen_max_percentage + 4) = uVar21;
  __return_storage_ptr__->query_complexity_max_percentage = dVar1;
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EstimatorStats GetErrorStatistics(std::vector<Estimates> algo_estimates, Count true_count) {

    int no_of_repeats = (int) algo_estimates.size();

    // Populate the error percentage for each run
    std::vector<double> algo_error_percentage_list(no_of_repeats);
    // TODO consider using lambda function
    for (int i = 0; i < no_of_repeats; i++)
        algo_error_percentage_list[i] =
                std::abs(algo_estimates[i].estimate - true_count) * 100 / true_count;

    int middle_index = no_of_repeats / 2;
    std::nth_element(algo_error_percentage_list.begin(), algo_error_percentage_list.begin() + middle_index,
                     algo_error_percentage_list.end());
    double median_error_percentage = algo_error_percentage_list[middle_index];

    double max_error_percentage = *std::max_element(algo_error_percentage_list.begin(),
                                                    algo_error_percentage_list.end());

    double sum = std::accumulate(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), 0.0);
    double mean_error_percentage = sum / no_of_repeats;

    std::vector<double> diff(no_of_repeats);
    std::transform(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), diff.begin(),
                   [mean_error_percentage](double x) { return x - mean_error_percentage; });
    double sq_sum = std::inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
    double stdev_error_percentage = std::sqrt(sq_sum / no_of_repeats);


    // Maximum edges and vertices seen over all the runs
    double vertices_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                         algo_estimates.end(),
                                                         ComparatorByVerticesSeen)).fraction_of_vertices_seen;
    double edges_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).fraction_of_edges_seen;

    double query_complexity_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).query_complexity;

    EstimatorStats est_stats = {no_of_repeats, mean_error_percentage, median_error_percentage,
                                stdev_error_percentage, max_error_percentage,
                                vertices_seen_percentage, edges_seen_percentage, query_complexity_percentage};
    return est_stats;
}